

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

GridHandle<pbrt::NanoVDBBuffer> *
pbrt::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,string *filename,string *gridName
          ,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long lVar3;
  NanoVDBBuffer buf;
  GridHandle<pbrt::NanoVDBBuffer> local_60;
  NanoVDBBuffer local_40;
  undefined4 extraout_var_02;
  
  local_40.bytesAllocated = 0;
  local_40.ptr = (uint8_t *)0x0;
  local_40.alloc.memoryResource = alloc.memoryResource;
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle(__return_storage_ptr__);
  nanovdb::io::readGrid<pbrt::NanoVDBBuffer>(&local_60,filename,gridName,0,&local_40);
  NanoVDBBuffer::operator=(&__return_storage_ptr__->mBuffer,&local_60.mBuffer);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&local_60);
  iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[2])
                    (__return_storage_ptr__);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[4])
                      (__return_storage_ptr__);
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x248) != 2) {
      iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[4])
                        (__return_storage_ptr__);
      if (*(int *)(CONCAT44(extraout_var_01,iVar1) + 0x248) != 0) {
        ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (loc,"%s: \"%s\" isn\'t a FogVolume grid?",filename,gridName);
      }
    }
    if (LOGGING_LogLevel < 1) {
      iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[4])();
      lVar2 = CONCAT44(extraout_var_02,iVar1);
      lVar3 = (ulong)*(uint *)(lVar2 + 0x250) * 0x120;
      local_60.super_GridHandleBase._vptr_GridHandleBase =
           *(_func_int ***)(*(long *)(lVar2 + 0x278 + lVar3) + 0x278 + lVar2 + lVar3);
      Log<std::__cxx11::string_const&,unsigned_long,std::__cxx11::string_const&>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.cpp"
                 ,0x126,"%s: found %d \"%s\" voxels",filename,(unsigned_long *)&local_60,gridName);
    }
  }
  NanoVDBBuffer::~NanoVDBBuffer(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static nanovdb::GridHandle<Buffer> readGrid(const std::string &filename,
                                            const std::string &gridName,
                                            const FileLoc *loc, Allocator alloc) {
    NanoVDBBuffer buf(alloc);
    nanovdb::GridHandle<Buffer> grid;
    try {
        grid =
            nanovdb::io::readGrid<Buffer>(filename, gridName, 0 /* not verbose */, buf);
    } catch (const std::exception &e) {
        ErrorExit("nanovdb: %s: %s", filename, e.what());
    }

    if (grid) {
        if (!grid.gridMetaData()->isFogVolume() && !grid.gridMetaData()->isUnknown())
            ErrorExit(loc, "%s: \"%s\" isn't a FogVolume grid?", filename, gridName);

        LOG_VERBOSE("%s: found %d \"%s\" voxels", filename,
                    grid.gridMetaData()->activeVoxelCount(), gridName);
    }

    return grid;
}